

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O0

int process_boundaries(vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_> *current_boundaries,
                      map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
                      *poly_map_destination)

{
  iterator this;
  bool bVar1;
  pointer pgVar2;
  size_type sVar3;
  mapped_type *this_00;
  pair<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_> local_b0;
  undefined1 local_90 [8];
  vector<co_ord,_std::allocator<co_ord>_> new_vector;
  uint local_70 [4];
  __normal_iterator<gdsBOUNDARY_*,_std::vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>_> local_60
  ;
  undefined1 local_58 [8];
  co_ord temp_co;
  iterator iStack_20;
  int key;
  iterator bound_iter;
  map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
  *poly_map_destination_local;
  vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_> *current_boundaries_local;
  
  bound_iter._M_current = (gdsBOUNDARY *)poly_map_destination;
  iStack_20 = std::vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>::begin(current_boundaries);
  temp_co.y.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  co_ord::co_ord((co_ord *)local_58);
  while( true ) {
    local_60._M_current =
         (gdsBOUNDARY *)
         std::vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>::end(current_boundaries);
    bVar1 = __gnu_cxx::operator!=(&stack0xffffffffffffffe0,&local_60);
    if (!bVar1) break;
    pgVar2 = __gnu_cxx::
             __normal_iterator<gdsBOUNDARY_*,_std::vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>_>
             ::operator->(&stack0xffffffffffffffe0);
    temp_co.y.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = pgVar2->layer;
    pgVar2 = __gnu_cxx::
             __normal_iterator<gdsBOUNDARY_*,_std::vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>_>
             ::operator->(&stack0xffffffffffffffe0);
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)local_58,&pgVar2->xCor);
    pgVar2 = __gnu_cxx::
             __normal_iterator<gdsBOUNDARY_*,_std::vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>_>
             ::operator->(&stack0xffffffffffffffe0);
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)
               &temp_co.x.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&pgVar2->yCor);
    local_70[0] = temp_co.y.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_;
    sVar3 = std::
            map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
            ::count((map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
                     *)bound_iter._M_current,local_70);
    if (sVar3 == 0) {
      std::vector<co_ord,_std::allocator<co_ord>_>::vector
                ((vector<co_ord,_std::allocator<co_ord>_> *)local_90);
      std::vector<co_ord,_std::allocator<co_ord>_>::push_back
                ((vector<co_ord,_std::allocator<co_ord>_> *)local_90,(value_type *)local_58);
      this = bound_iter;
      pgVar2 = __gnu_cxx::
               __normal_iterator<gdsBOUNDARY_*,_std::vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>_>
               ::operator->(&stack0xffffffffffffffe0);
      std::pair<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>::
      pair<unsigned_int_&,_std::vector<co_ord,_std::allocator<co_ord>_>_&,_true>
                (&local_b0,&pgVar2->layer,(vector<co_ord,_std::allocator<co_ord>_> *)local_90);
      std::
      map<unsigned_int,std::vector<co_ord,std::allocator<co_ord>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<co_ord,std::allocator<co_ord>>>>>
      ::insert<std::pair<unsigned_int,std::vector<co_ord,std::allocator<co_ord>>>>
                ((map<unsigned_int,std::vector<co_ord,std::allocator<co_ord>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<co_ord,std::allocator<co_ord>>>>>
                  *)this._M_current,&local_b0);
      std::pair<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>::~pair(&local_b0);
      std::vector<co_ord,_std::allocator<co_ord>_>::~vector
                ((vector<co_ord,_std::allocator<co_ord>_> *)local_90);
    }
    else {
      new_vector.super__Vector_base<co_ord,_std::allocator<co_ord>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage._4_4_ =
           temp_co.y.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_end_of_storage._4_4_;
      this_00 = std::
                map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
                ::operator[]((map<unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<co_ord,_std::allocator<co_ord>_>_>_>_>
                              *)bound_iter._M_current,
                             (key_type_conflict *)
                             ((long)&new_vector.super__Vector_base<co_ord,_std::allocator<co_ord>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      std::vector<co_ord,_std::allocator<co_ord>_>::push_back(this_00,(value_type *)local_58);
    }
    __gnu_cxx::
    __normal_iterator<gdsBOUNDARY_*,_std::vector<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>_>::
    operator++(&stack0xffffffffffffffe0,0);
  }
  co_ord::~co_ord((co_ord *)local_58);
  return 0;
}

Assistant:

int process_boundaries(vector<gdsBOUNDARY> &current_boundaries,
                       map<unsigned int, vector<co_ord>> &poly_map_destination)
{
  auto bound_iter = current_boundaries.begin();
  int key = 0;
  co_ord temp_co;
  while (bound_iter != current_boundaries.end()) {
    key = bound_iter->layer;
    temp_co.x = bound_iter->xCor;
    temp_co.y = bound_iter->yCor;
    if (poly_map_destination.count(key) > 0) // append
    {
      poly_map_destination[key].push_back(temp_co);
    } else {
      vector<co_ord> new_vector;
      new_vector.push_back(temp_co);
      poly_map_destination.insert(
          pair<unsigned int, vector<co_ord>>(bound_iter->layer, new_vector));
    }
    bound_iter++;
  }
  return EXIT_SUCCESS;
}